

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O3

void checktab(lua_State *L,int arg,int what)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = lua_type(L,arg);
  if (iVar1 == 5) {
    return;
  }
  iVar1 = lua_getmetatable(L,arg);
  if (iVar1 != 0) {
    uVar2 = 1;
    if ((what & 1U) != 0) {
      lua_pushstring(L,"__index");
      iVar1 = lua_rawget(L,-2);
      uVar2 = 2;
      if (iVar1 == 0) goto LAB_0011a0ba;
    }
    if ((what & 2U) != 0) {
      lua_pushstring(L,"__newindex");
      iVar1 = lua_rawget(L,~uVar2);
      if (iVar1 == 0) goto LAB_0011a0ba;
      uVar2 = uVar2 + 1;
    }
    if ((what & 4U) != 0) {
      lua_pushstring(L,"__len");
      iVar1 = lua_rawget(L,~uVar2);
      if (iVar1 == 0) goto LAB_0011a0ba;
      uVar2 = uVar2 + 1;
    }
    lua_settop(L,~uVar2);
    return;
  }
LAB_0011a0ba:
  luaL_checktype(L,arg,5);
  return;
}

Assistant:

static void checktab(lua_State *L, int arg, int what) {
    if (lua_type(L, arg) != LUA_TTABLE) {  /* is it not a table? */
        int n = 1;  /* number of elements to pop */
        if (lua_getmetatable(L, arg) &&  /* must have metatable */
            (!(what & TAB_R) || checkfield(L, "__index", ++n)) &&
            (!(what & TAB_W) || checkfield(L, "__newindex", ++n)) &&
            (!(what & TAB_L) || checkfield(L, "__len", ++n))) {
            lua_pop(L, n);  /* pop metatable and tested metamethods */
        } else
            luaL_checktype(L, arg, LUA_TTABLE);  /* force an error */
    }
}